

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.h
# Opt level: O2

uint bsplib::TicToc::push(Category c)

{
  s_pos = c * s_pow + s_pos;
  s_pow = s_pow * 0xf;
  if (s_pow < 1000000) {
    if ((ulong)(DAT_0011b318 - s_timers >> 5) <= (ulong)s_pos) {
      std::vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_>::resize
                ((vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_> *)
                 &s_timers,(ulong)(s_pos + 1));
    }
    return s_pos;
  }
  __assert_fail("s_pow < 1000000",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/tictoc.h"
                ,0x73,"static unsigned int bsplib::TicToc::push(Category)");
}

Assistant:

static unsigned push(Category c ) {
        s_pos += s_pow * c;
        s_pow *= N_CATEGORIES;
        assert( s_pow < 1000000 );

        if (s_timers.size() <= s_pos)
            s_timers.resize( s_pos + 1);

        return s_pos;
    }